

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckInputAttributes(TidyDocImpl *doc,Node *node)

{
  bool bVar1;
  bool bVar2;
  Bool BVar3;
  int iVar4;
  AttVal *local_28;
  AttVal *av;
  Bool MustHaveAlt;
  Bool HasAlt;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  bVar2 = false;
  bVar1 = false;
  for (local_28 = node->attributes; local_28 != (AttVal *)0x0; local_28 = local_28->next) {
    if ((((local_28 != (AttVal *)0x0) && (local_28->dict != (Attribute *)0x0)) &&
        (local_28->dict->id == TidyAttr_TYPE)) &&
       (((BVar3 = hasValue(local_28), BVar3 != no && (BVar3 = Level1_Enabled(doc), BVar3 != no)) &&
        ((local_28 != (AttVal *)0x0 &&
         ((local_28->value != (tmbstr)0x0 &&
          (iVar4 = prvTidytmbstrcasecmp(local_28->value,"image"), iVar4 == 0)))))))) {
      bVar1 = true;
    }
    if ((((local_28 != (AttVal *)0x0) && (local_28->dict != (Attribute *)0x0)) &&
        (local_28->dict->id == TidyAttr_ALT)) && (BVar3 = hasValue(local_28), BVar3 != no)) {
      bVar2 = true;
    }
  }
  if ((bVar1) && (!bVar2)) {
    prvTidyReportAccessError(doc,node,0x29c);
  }
  return;
}

Assistant:

static void CheckInputAttributes( TidyDocImpl* doc, Node* node )
{
    Bool HasAlt = no;
    Bool MustHaveAlt = no;
    AttVal* av;

    /* Checks attributes within the INPUT element */
    for (av = node->attributes; av != NULL; av = av->next)
    {
        /* 'VALUE' must be found if the 'TYPE' is 'text' or 'checkbox' */
        if ( attrIsTYPE(av) && hasValue(av) )
        {
            if (Level1_Enabled( doc ))
            {
                if (AttrValueIs(av, "image"))
                {
                    MustHaveAlt = yes;
                }
            }

        }

        if ( attrIsALT(av) && hasValue(av) )
        {
            HasAlt = yes;
        }
    }

    if ( MustHaveAlt && !HasAlt )
    {
        TY_(ReportAccessError)( doc, node, IMG_BUTTON_MISSING_ALT );
    }

}